

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O1

Instr * __thiscall
LowererMD::LoadInputParamCount(LowererMD *this,Instr *instrInsert,int adjust,bool needFlags)

{
  SymOpnd *src1Opnd;
  StackSym *sym;
  RegOpnd *dstOpnd;
  Instr *pIVar1;
  IntConstOpnd *pIVar2;
  
  src1Opnd = Lowerer::LoadCallInfo(instrInsert);
  sym = StackSym::New(TyInt64,this->m_func);
  dstOpnd = IR::RegOpnd::New(sym,TyInt64,this->m_func);
  pIVar1 = IR::Instr::New(MOV,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instrInsert,pIVar1);
  pIVar2 = IR::IntConstOpnd::New(0xffffff,TyInt64,this->m_func,true);
  pIVar1 = IR::Instr::New(AND,&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,&pIVar2->super_Opnd,
                          this->m_func);
  IR::Instr::InsertBefore(instrInsert,pIVar1);
  pIVar2 = IR::IntConstOpnd::New((long)-adjust,TyInt64,this->m_func,false);
  pIVar1 = Lowerer::InsertSub(true,&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,&pIVar2->super_Opnd,
                              instrInsert);
  return pIVar1;
}

Assistant:

IR::Instr *
LowererMD::LoadInputParamCount(IR::Instr * instrInsert, int adjust, bool needFlags)
{
    IR::Instr *   instr;
    IR::RegOpnd * dstOpnd;
    IR::SymOpnd * srcOpnd;

    srcOpnd = Lowerer::LoadCallInfo(instrInsert);
    dstOpnd = IR::RegOpnd::New(StackSym::New(TyMachReg, this->m_func), TyMachReg, this->m_func);
    instr = IR::Instr::New(Js::OpCode::MOV, dstOpnd, srcOpnd, this->m_func);
    instrInsert->InsertBefore(instr);

    // Copy the callinfo before masking off the param count

    Assert(Js::CallInfo::ksizeofCount == 24);

    // Mask off call flags from callinfo
    instr = IR::Instr::New(Js::OpCode::AND, dstOpnd, dstOpnd,
        IR::IntConstOpnd::New(0x00FFFFFF, TyMachReg, this->m_func, true), this->m_func);
    instrInsert->InsertBefore(instr);

    instr = m_lowerer->InsertSub(true, dstOpnd, dstOpnd, IR::IntConstOpnd::New(-adjust, TyMachReg, this->m_func), instrInsert);

    return instr;
}